

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase630::run(TestCase630 *this)

{
  _func_int *p_Var1;
  PromiseArena *pPVar2;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  AsyncInputStream AVar3;
  OwnPromiseNode OVar4;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar5;
  void *pvVar6;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:656:11)>
  *location_03;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:658:11)>
  *location_04;
  SimpleTransformPromiseNode<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:641:13)>
  *location_05;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:644:11)>
  *location_06;
  PromiseBase location_07;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:654:13)>
  *location_08;
  OwnPromiseNode intermediate_1;
  AsyncInputStream local_1a0;
  OwnPromiseNode intermediate_3;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_190;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_188;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_180;
  OwnPromiseNode local_178;
  String result2;
  void *continuationTracePtr_2;
  String *pSStack_150;
  char *local_148;
  bool local_138;
  AsyncInputStream local_130;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:646:11),_unsigned_long>
  promise;
  char receiveBuffer2 [4];
  char receiveBuffer1 [4];
  String result;
  anon_class_8_1_89902eac_for_func local_100;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> receivedStream;
  CapabilityPipe pipe;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> local_98;
  CapabilityPipe pipe2;
  AsyncIoContext ioContext;
  
  setupAsyncIo();
  (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[2])(&pipe);
  (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[2])(&pipe2);
  receiveBuffer1[0] = '\0';
  receiveBuffer1[1] = '\0';
  receiveBuffer1[2] = '\0';
  receiveBuffer1[3] = '\0';
  receiveBuffer2[0] = '\0';
  receiveBuffer2[1] = '\0';
  receiveBuffer2[2] = '\0';
  receiveBuffer2[3] = '\0';
  receivedStream.disposer = (Disposer *)0x0;
  receivedStream.ptr = (AsyncCapabilityStream *)0x0;
  AsyncCapabilityStream::receiveStream((AsyncCapabilityStream *)&stack0xfffffffffffffe60);
  result.content.ptr =
       (char *)kj::_::
               SimpleTransformPromiseNode<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:641:13)>
               ::anon_class_8_1_58f9daff_for_func::operator();
  p_Var1 = local_1a0._vptr_AsyncInputStream[1];
  local_188.ptr = (PromiseNode *)&receivedStream;
  if (p_Var1 == (_func_int *)0x0 ||
      (ulong)((long)local_1a0._vptr_AsyncInputStream - (long)p_Var1) < 0x28) {
    pvVar6 = operator_new(0x400);
    location_05 = (SimpleTransformPromiseNode<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:641:13)>
                   *)((long)pvVar6 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>,kj::(anonymous_namespace)::TestCase630::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase630::run()::__0,void*&>
              (location_05,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffe60,
               (anon_class_8_1_58f9daff_for_func *)&local_188,(void **)&result);
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    local_1a0._vptr_AsyncInputStream[1] = (_func_int *)0x0;
    location_05 = (SimpleTransformPromiseNode<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:641:13)>
                   *)(local_1a0._vptr_AsyncInputStream + -5);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>,kj::(anonymous_namespace)::TestCase630::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase630::run()::__0,void*&>
              (location_05,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffe60,
               (anon_class_8_1_58f9daff_for_func *)&local_188,(void **)&result);
    local_1a0._vptr_AsyncInputStream[-4] = p_Var1;
  }
  continuationTracePtr_2 = &DAT_003d3151;
  pSStack_150 = (String *)&DAT_003d31b0;
  local_148 = (char *)0x4c0000058b;
  location.function = &DAT_003d31b0;
  location.fileName = &DAT_003d3151;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  result2.content.ptr = (char *)location_05;
  kj::_::maybeChain<void>(&intermediate_3,(Promise<void> *)&result2,location);
  OVar4 = intermediate_3;
  intermediate_3.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  local_190.ptr = OVar4.ptr;
  intermediate_1.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_1);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&result2);
  OVar5.ptr = local_190.ptr;
  result2.content.ptr =
       (char *)kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:644:11)>
               ::anon_class_16_2_5e707987_for_func::operator();
  pPVar2 = ((local_190.ptr)->super_PromiseArenaMember).arena;
  result.content.ptr = (char *)&receivedStream;
  result.content.size_ = (size_t)receiveBuffer2;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_190.ptr - (long)pPVar2) < 0x30) {
    pvVar6 = operator_new(0x400);
    location_06 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:644:11)>
                   *)((long)pvVar6 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase630::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase630::run()::__1,void*&>
              (location_06,&local_190,(anon_class_16_2_5e707987_for_func *)&result,(void **)&result2
              );
    *(void **)((long)pvVar6 + 0x3d8) = pvVar6;
  }
  else {
    ((local_190.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_06 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:644:11)>
                   *)(local_190.ptr + -3);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase630::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase630::run()::__1,void*&>
              (location_06,&local_190,(anon_class_16_2_5e707987_for_func *)&result,(void **)&result2
              );
    OVar5.ptr[-3].super_PromiseArenaMember.arena = pPVar2;
  }
  continuationTracePtr_2 = &DAT_003d3151;
  pSStack_150 = (String *)&DAT_003d31b0;
  local_148 = (char *)0x4c0000058b;
  location_00.function = &DAT_003d31b0;
  location_00.fileName = &DAT_003d3151;
  location_00.lineNumber = 0x58b;
  location_00.columnNumber = 0x4c;
  intermediate_1.ptr = (PromiseNode *)location_06;
  kj::_::maybeChain<unsigned_long>(&local_178,(Promise<unsigned_long> *)&intermediate_1,location_00)
  ;
  OVar4.ptr = local_178.ptr;
  local_178.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_178);
  local_180.ptr = OVar4.ptr;
  intermediate_3.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_1);
  OVar5.ptr = local_180.ptr;
  continuationTracePtr_2 =
       kj::_::
       SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:646:11)>
       ::anon_class_8_1_8ba005cd_for_func::operator();
  pPVar2 = ((local_180.ptr)->super_PromiseArenaMember).arena;
  intermediate_3.ptr = (PromiseNode *)receiveBuffer2;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_180.ptr - (long)pPVar2) < 0x28) {
    pvVar6 = operator_new(0x400);
    location_07.node.ptr = (OwnPromiseNode)((long)pvVar6 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase630::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase630::run()::__2,void*&>
              ((SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:646:11)>
                *)location_07.node.ptr,&local_180,
               (anon_class_8_1_8ba005cd_for_func *)&intermediate_3,&continuationTracePtr_2);
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    ((local_180.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_07.node.ptr = (OwnPromiseNode)&local_180.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase630::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase630::run()::__2,void*&>
              ((SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:646:11)>
                *)location_07.node.ptr,&local_180,
               (anon_class_8_1_8ba005cd_for_func *)&intermediate_3,&continuationTracePtr_2);
    OVar5.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  result2.content.ptr = (char *)0x0;
  intermediate_1.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)location_07.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_1);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&result2);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_180);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_190);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffe60);
  local_98.disposer = pipe.ends[1].disposer;
  local_98.ptr = pipe.ends[1].ptr;
  pipe.ends[1].ptr = (AsyncCapabilityStream *)0x0;
  AsyncCapabilityStream::sendStream
            ((AsyncCapabilityStream *)&stack0xfffffffffffffed0,
             (Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)pipe2.ends[0].ptr);
  local_100.pipe = &pipe;
  result2.content.ptr =
       (char *)kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:654:13)>
               ::anon_class_8_1_89902eac_for_func::operator();
  p_Var1 = local_130._vptr_AsyncInputStream[1];
  if (p_Var1 == (_func_int *)0x0 ||
      (ulong)((long)local_130._vptr_AsyncInputStream - (long)p_Var1) < 0x28) {
    pvVar6 = operator_new(0x400);
    location_08 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:654:13)>
                   *)((long)pvVar6 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase630::run()::__3>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase630::run()::__3,void*&>
              (location_08,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffed0,
               &local_100,(void **)&result2);
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    local_130._vptr_AsyncInputStream[1] = (_func_int *)0x0;
    location_08 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:654:13)>
                   *)(local_130._vptr_AsyncInputStream + -5);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase630::run()::__3>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase630::run()::__3,void*&>
              (location_08,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffed0,
               &local_100,(void **)&result2);
    local_130._vptr_AsyncInputStream[-4] = p_Var1;
  }
  continuationTracePtr_2 = &DAT_003d3151;
  pSStack_150 = (String *)&DAT_003d31b0;
  local_148 = (char *)0x4c0000058b;
  location_01.function = &DAT_003d31b0;
  location_01.fileName = &DAT_003d3151;
  location_01.lineNumber = 0x58b;
  location_01.columnNumber = 0x4c;
  intermediate_1.ptr = (PromiseNode *)location_08;
  kj::_::maybeChain<void>(&local_178,(Promise<void> *)&intermediate_1,location_01);
  OVar4.ptr = local_178.ptr;
  local_178.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_178);
  local_188.ptr = OVar4.ptr;
  intermediate_3.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_1);
  OVar5.ptr = local_188.ptr;
  result2.content.ptr = (char *)&pipe;
  intermediate_1.ptr =
       (PromiseNode *)
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:656:11)>
       ::anon_class_16_2_40a49b79_for_func::operator();
  pPVar2 = ((local_188.ptr)->super_PromiseArenaMember).arena;
  result2.content.size_ = (size_t)receiveBuffer1;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_188.ptr - (long)pPVar2) < 0x30) {
    pvVar6 = operator_new(0x400);
    location_03 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:656:11)>
                   *)((long)pvVar6 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase630::run()::__4>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase630::run()::__4,void*&>
              (location_03,&local_188,(anon_class_16_2_40a49b79_for_func *)&result2,
               &intermediate_1.ptr);
    *(void **)((long)pvVar6 + 0x3d8) = pvVar6;
  }
  else {
    ((local_188.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_03 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:656:11)>
                   *)(local_188.ptr + -3);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase630::run()::__4>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase630::run()::__4,void*&>
              (location_03,&local_188,(anon_class_16_2_40a49b79_for_func *)&result2,
               &intermediate_1.ptr);
    OVar5.ptr[-3].super_PromiseArenaMember.arena = pPVar2;
  }
  continuationTracePtr_2 = &DAT_003d3151;
  pSStack_150 = (String *)&DAT_003d31b0;
  local_148 = (char *)0x4c0000058b;
  location_02.function = &DAT_003d31b0;
  location_02.fileName = &DAT_003d3151;
  location_02.lineNumber = 0x58b;
  location_02.columnNumber = 0x4c;
  intermediate_3.ptr = (PromiseNode *)location_03;
  kj::_::maybeChain<unsigned_long>(&local_180,(Promise<unsigned_long> *)&intermediate_3,location_02)
  ;
  OVar5.ptr = local_180.ptr;
  local_180.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_180);
  local_1a0._vptr_AsyncInputStream = (_func_int **)OVar5.ptr;
  local_178.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_178);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  AVar3._vptr_AsyncInputStream = local_1a0._vptr_AsyncInputStream;
  continuationTracePtr_2 =
       kj::_::
       SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:658:11)>
       ::anon_class_8_1_8ba005cc_for_func::operator();
  p_Var1 = local_1a0._vptr_AsyncInputStream[1];
  local_178.ptr = (PromiseNode *)receiveBuffer1;
  if (p_Var1 == (_func_int *)0x0 ||
      (ulong)((long)local_1a0._vptr_AsyncInputStream - (long)p_Var1) < 0x28) {
    pvVar6 = operator_new(0x400);
    location_04 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:658:11)>
                   *)((long)pvVar6 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase630::run()::__5>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase630::run()::__5,void*&>
              (location_04,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffe60,
               (anon_class_8_1_8ba005cc_for_func *)&local_178,&continuationTracePtr_2);
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  else {
    local_1a0._vptr_AsyncInputStream[1] = (_func_int *)0x0;
    location_04 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:658:11)>
                   *)(local_1a0._vptr_AsyncInputStream + -5);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase630::run()::__5>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase630::run()::__5,void*&>
              (location_04,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffe60,
               (anon_class_8_1_8ba005cc_for_func *)&local_178,&continuationTracePtr_2);
    AVar3._vptr_AsyncInputStream[-4] = p_Var1;
  }
  intermediate_1.ptr = (PromiseNode *)0x0;
  intermediate_3.ptr = (PromiseNode *)0x0;
  local_190.ptr = (PromiseNode *)location_04;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_1);
  Promise<kj::String>::wait((Promise<kj::String> *)&result,&local_190);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_190);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffe60);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_188);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xfffffffffffffed0);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose(&local_98);
  Promise<kj::String>::wait((Promise<kj::String> *)&result2,&promise);
  intermediate_1.ptr = (PromiseNode *)0x401abd;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)&continuationTracePtr_2,
             (DebugExpression<char_const(&)[4]> *)&intermediate_1,&result);
  if ((local_138 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x299,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (result)\", _kjCondition, \"bar\", result",
               (char (*) [37])"failed: expected (\"bar\") == (result)",
               (DebugComparison<const_char_(&)[4],_kj::String_&> *)&continuationTracePtr_2,
               (char (*) [4])0x401abd,&result);
  }
  intermediate_1.ptr = (PromiseNode *)0x423c58;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)&continuationTracePtr_2,
             (DebugExpression<char_const(&)[4]> *)&intermediate_1,&result2);
  if ((local_138 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x29a,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (result2)\", _kjCondition, \"foo\", result2"
               ,(char (*) [38])"failed: expected (\"foo\") == (result2)",
               (DebugComparison<const_char_(&)[4],_kj::String_&> *)&continuationTracePtr_2,
               (char (*) [4])0x423c58,&result2);
  }
  Array<char>::~Array(&result2.content);
  Array<char>::~Array(&result.content);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::dispose(&receivedStream);
  CapabilityPipe::~CapabilityPipe(&pipe2);
  CapabilityPipe::~CapabilityPipe(&pipe);
  AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(AsyncIo, CapabilityPipe) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newCapabilityPipe();
  auto pipe2 = ioContext.provider->newCapabilityPipe();
  char receiveBuffer1[4]{};
  char receiveBuffer2[4]{};

  // Expect to receive a stream, then write "bar" to it, then receive "foo" from it.
  Own<AsyncCapabilityStream> receivedStream;
  auto promise = pipe2.ends[1]->receiveStream()
      .then([&](Own<AsyncCapabilityStream> stream) {
    receivedStream = kj::mv(stream);
    return receivedStream->write("bar"_kjb);
  }).then([&]() {
    return receivedStream->tryRead(receiveBuffer2, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer2, n);
  });

  // Send a stream, then write "foo" to the other end of the sent stream, then receive "bar"
  // from it.
  kj::String result = pipe2.ends[0]->sendStream(kj::mv(pipe.ends[1]))
      .then([&]() {
    return pipe.ends[0]->write("foo"_kjb);
  }).then([&]() {
    return pipe.ends[0]->tryRead(receiveBuffer1, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer1, n);
  }).wait(ioContext.waitScope);

  kj::String result2 = promise.wait(ioContext.waitScope);

  EXPECT_EQ("bar", result);
  EXPECT_EQ("foo", result2);
}